

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O1

bool flow::transform::eliminateLinearBr(IRHandler *handler)

{
  BasicBlock *this;
  BasicBlock *bb;
  pointer ppBVar1;
  _func_int **in_RAX;
  TerminateInstr *pTVar2;
  long lVar3;
  _List_node_base *p_Var4;
  pointer *__ptr;
  byte unaff_BPL;
  _func_int **local_38;
  
  p_Var4 = (_List_node_base *)&handler->blocks_;
  local_38 = in_RAX;
  do {
    p_Var4 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&handler->blocks_) {
      unaff_BPL = 0;
      break;
    }
    this = (BasicBlock *)p_Var4[1]._M_next;
    pTVar2 = BasicBlock::getTerminator(this);
    if (pTVar2 == (TerminateInstr *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(pTVar2,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0);
    }
    if (lVar3 != 0) {
      bb = (BasicBlock *)**(undefined8 **)(lVar3 + 0x50);
      ppBVar1 = (bb->predecessors_).
                super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((long)(bb->predecessors_).
                 super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)ppBVar1 == 8) && (*ppBVar1 == this)) {
        BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffc8,(char *)this);
        if (local_38 != (_func_int **)0x0) {
          (**(code **)(*local_38 + 8))();
        }
        local_38 = (_func_int **)0x0;
        BasicBlock::merge_back(this,bb);
        unaff_BPL = 1;
      }
      else {
        unaff_BPL = 0;
      }
    }
  } while (lVar3 == 0);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool eliminateLinearBr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless linear br
    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      if (br->targetBlock()->predecessors().size() != 1)
        return false;

      if (br->targetBlock()->predecessors().front() != bb)
        return false;

      // we are the only predecessor of BR's target block, so merge them
      BasicBlock* nextBB = br->targetBlock();

      // FLOW_TRACE("flow: eliminate linear BR-instruction from {} to {}", bb->name(), nextBB->name());

      // remove old terminator
      bb->remove(br);

      // merge nextBB
      bb->merge_back(nextBB);

      // destroy unused BB
      //bb->getHandler()->erase(nextBB);

      return true;
    }
  }

  return false;
}